

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::remapNonEntryPointIO(HlslParseContext *this,TFunction *function)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  HlslParseContext *pHVar3;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  int i;
  uint uVar4;
  undefined4 extraout_var_00;
  
  iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xc])(function);
  iVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x38))
                    ((long *)CONCAT44(extraout_var,iVar2));
  if (iVar2 != 0) {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0xd])(function);
    pHVar3 = (HlslParseContext *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*(pHVar3->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])();
    clearUniformInputOutput(pHVar3,(TQualifier *)CONCAT44(extraout_var_01,iVar2));
  }
  uVar4 = 0;
  while( true ) {
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x24])(function);
    if (iVar2 <= (int)uVar4) break;
    iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar4);
    bVar1 = isStructBufferType(this,*(TType **)(CONCAT44(extraout_var_02,iVar2) + 8));
    if (!bVar1) {
      iVar2 = (*(function->super_TSymbol)._vptr_TSymbol[0x27])(function,(ulong)uVar4);
      pHVar3 = *(HlslParseContext **)(CONCAT44(extraout_var_03,iVar2) + 8);
      iVar2 = (*(pHVar3->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[10])();
      clearUniformInputOutput(pHVar3,(TQualifier *)CONCAT44(extraout_var_04,iVar2));
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void HlslParseContext::remapNonEntryPointIO(TFunction& function)
{
    // return value
    if (function.getType().getBasicType() != EbtVoid)
        clearUniformInputOutput(function.getWritableType().getQualifier());

    // parameters.
    // References to structuredbuffer types are left unmodified
    for (int i = 0; i < function.getParamCount(); i++)
        if (!isReference(*function[i].type))
            clearUniformInputOutput(function[i].type->getQualifier());
}